

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_clock.c
# Opt level: O1

OPJ_FLOAT64 opj_clock(void)

{
  rusage t;
  rusage local_98;
  
  getrusage(RUSAGE_SELF,&local_98);
  return (OPJ_FLOAT64)
         ((double)(local_98.ru_stime.tv_usec + local_98.ru_utime.tv_usec) * 1e-06 +
         (double)(local_98.ru_stime.tv_sec + local_98.ru_utime.tv_sec));
}

Assistant:

OPJ_FLOAT64 opj_clock(void) {
#ifdef _WIN32
	/* _WIN32: use QueryPerformance (very accurate) */
    LARGE_INTEGER freq , t ;
    /* freq is the clock speed of the CPU */
    QueryPerformanceFrequency(&freq) ;
	/* cout << "freq = " << ((double) freq.QuadPart) << endl; */
    /* t is the high resolution performance counter (see MSDN) */
    QueryPerformanceCounter ( & t ) ;
    return ( t.QuadPart /(OPJ_FLOAT64) freq.QuadPart ) ;
#else
	/* Unix or Linux: use resource usage */
    struct rusage t;
    OPJ_FLOAT64 procTime;
    /* (1) Get the rusage data structure at this moment (man getrusage) */
    getrusage(0,&t);
    /* (2) What is the elapsed time ? - CPU time = User time + System time */
	/* (2a) Get the seconds */
    procTime = (OPJ_FLOAT64)(t.ru_utime.tv_sec + t.ru_stime.tv_sec);
    /* (2b) More precisely! Get the microseconds part ! */
    return ( procTime + (OPJ_FLOAT64)(t.ru_utime.tv_usec + t.ru_stime.tv_usec) * 1e-6 ) ;
#endif
}